

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigJust.c
# Opt level: O2

int Aig_ObjTerSimulate(Aig_Man_t *pAig,Aig_Obj_t *pNode,Vec_Int_t *vSuppLits)

{
  uint uVar1;
  Aig_Obj_t *pNode_00;
  int iVar2;
  
  Aig_ManIncrementTravId(pAig);
  iVar2 = 0;
  while( true ) {
    if (vSuppLits->nSize <= iVar2) {
      iVar2 = Aig_ObjTerSimulate_rec(pAig,pNode);
      return iVar2;
    }
    uVar1 = Vec_IntEntry(vSuppLits,iVar2);
    if ((int)uVar1 < 0) break;
    pNode_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,uVar1 >> 1);
    Aig_ObjSetTerValue(pNode_00,2 - (uVar1 & 1));
    pNode_00->TravId = pAig->nTravIds;
    iVar2 = iVar2 + 1;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf2,"int Abc_Lit2Var(int)");
}

Assistant:

int Aig_ObjTerSimulate( Aig_Man_t * pAig, Aig_Obj_t * pNode, Vec_Int_t * vSuppLits )
{
    Aig_Obj_t * pObj;
    int i, Entry;
    Aig_ManIncrementTravId( pAig );
    Vec_IntForEachEntry( vSuppLits, Entry, i )
    {
        pObj = Aig_ManCi( pAig, Abc_Lit2Var(Entry) );
        Aig_ObjSetTerValue( pObj, Abc_LitIsCompl(Entry) ? AIG_VAL0 : AIG_VAL1 );
        Aig_ObjSetTravIdCurrent( pAig, pObj );
//printf( "%d ", Entry );
    }
//printf( "\n" );
    return Aig_ObjTerSimulate_rec( pAig, pNode );
}